

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O2

string_t __thiscall
duckdb::CastFromBitToString::Operation<duckdb::string_t>
          (CastFromBitToString *this,string_t input,Vector *vector)

{
  Vector *vector_00;
  idx_t len;
  char *pcVar1;
  bitstring_t bits;
  string_t result;
  anon_union_16_2_67f50693_for_value local_28;
  
  bits.value._0_8_ = input.value._0_8_;
  vector_00 = (Vector *)Bit::BitLength((Bit *)this,(bitstring_t)input.value);
  local_28.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)
       StringVector::EmptyString(input.value._8_8_,vector_00,len);
  pcVar1 = local_28._8_8_;
  if (local_28._0_4_ < 0xd) {
    pcVar1 = local_28.pointer.prefix;
  }
  bits.value.pointer.ptr = pcVar1;
  Bit::ToString((Bit *)this,bits,local_28.pointer.prefix);
  string_t::Finalize((string_t *)&local_28.pointer);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_28.pointer;
}

Assistant:

string_t CastFromBitToString::Operation(string_t input, Vector &vector) {

	idx_t result_size = Bit::BitLength(input);
	string_t result = StringVector::EmptyString(vector, result_size);
	Bit::ToString(input, result.GetDataWriteable());
	result.Finalize();

	return result;
}